

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O0

void score_affine(double *mat,Correspondence *points,int num_points,RANSAC_MOTION *model)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double sse;
  double dy;
  double dx;
  double proj_y;
  double proj_x;
  double y2;
  double x2;
  double y1;
  double x1;
  int i;
  RANSAC_MOTION *model_local;
  int num_points_local;
  Correspondence *points_local;
  double *mat_local;
  
  model->num_inliers = 0;
  model->sse = 0.0;
  for (i = 0; i < num_points; i = i + 1) {
    dVar2 = (mat[2] * points[i].x + mat[3] * points[i].y + *mat) - points[i].rx;
    dVar3 = (mat[4] * points[i].x + mat[5] * points[i].y + mat[1]) - points[i].ry;
    dVar2 = dVar2 * dVar2 + dVar3 * dVar3;
    if (dVar2 < 1.5625) {
      iVar1 = model->num_inliers;
      model->num_inliers = iVar1 + 1;
      model->inlier_indices[iVar1] = i;
      model->sse = dVar2 + model->sse;
    }
  }
  return;
}

Assistant:

static void score_affine(const double *mat, const Correspondence *points,
                         int num_points, RANSAC_MOTION *model) {
  model->num_inliers = 0;
  model->sse = 0.0;

  for (int i = 0; i < num_points; ++i) {
    const double x1 = points[i].x;
    const double y1 = points[i].y;
    const double x2 = points[i].rx;
    const double y2 = points[i].ry;

    const double proj_x = mat[2] * x1 + mat[3] * y1 + mat[0];
    const double proj_y = mat[4] * x1 + mat[5] * y1 + mat[1];

    const double dx = proj_x - x2;
    const double dy = proj_y - y2;
    const double sse = dx * dx + dy * dy;

    if (sse < INLIER_THRESHOLD_SQUARED) {
      model->inlier_indices[model->num_inliers++] = i;
      model->sse += sse;
    }
  }
}